

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O0

void __thiscall Func::InitializeEquivalentTypeGuard(Func *this,JitEquivalentTypeGuard *guard)

{
  bool bVar1;
  JitArenaAllocator *pJVar2;
  Allocator *pAVar3;
  EquivalentTypeCache *pEVar4;
  TrackAllocData local_80;
  code *local_58;
  undefined8 local_50;
  TrackAllocData local_48;
  EquivalentTypeCache *local_20;
  EquivalentTypeCache *cache;
  JitEquivalentTypeGuard *guard_local;
  Func *this_local;
  
  local_20 = (EquivalentTypeCache *)0x0;
  cache = (EquivalentTypeCache *)guard;
  guard_local = (JitEquivalentTypeGuard *)this;
  bVar1 = IsOOPJIT(this);
  if (bVar1) {
    pJVar2 = this->m_alloc;
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_48,(type_info *)&Js::EquivalentTypeCache::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
               ,0x666);
    pJVar2 = (JitArenaAllocator *)
             Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
             TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                            pJVar2,&local_48);
    local_58 = Memory::JitArenaAllocator::AllocZero;
    local_50 = 0;
    pEVar4 = (EquivalentTypeCache *)new<Memory::JitArenaAllocator>(0x60,pJVar2,0x4e9be0);
    Js::EquivalentTypeCache::EquivalentTypeCache(pEVar4);
    local_20 = pEVar4;
  }
  else {
    pAVar3 = GetTransferDataAllocator(this);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_80,(type_info *)&Js::EquivalentTypeCache::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
               ,0x66a);
    pAVar3 = NativeCodeData::Allocator::TrackAllocInfo(pAVar3,&local_80);
    pEVar4 = (EquivalentTypeCache *)
             new<NativeCodeData::AllocatorNoFixup<Js::EquivalentTypeCache>>
                       (0x60,(AllocatorNoFixup<Js::EquivalentTypeCache> *)pAVar3,0x55a980);
    Js::EquivalentTypeCache::EquivalentTypeCache(pEVar4);
    local_20 = pEVar4;
  }
  Js::JitEquivalentTypeGuard::SetCache((JitEquivalentTypeGuard *)cache,local_20);
  Js::EquivalentTypeCache::SetGuard(local_20,(PropertyGuard *)cache);
  SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>::Prepend
            (&this->equivalentTypeGuards->
              super_SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>,
             (JitEquivalentTypeGuard **)&cache);
  return;
}

Assistant:

void
Func::InitializeEquivalentTypeGuard(Js::JitEquivalentTypeGuard * guard)
{
    // If we want to hard code the address of the cache, we will need to go back to allocating it from the native code data allocator.
    // We would then need to maintain consistency (double write) to both the recycler allocated cache and the one on the heap.
    Js::EquivalentTypeCache* cache = nullptr;
    if (this->IsOOPJIT())
    {
        cache = JitAnewZ(this->m_alloc, Js::EquivalentTypeCache);
    }
    else
    {
        cache = NativeCodeDataNewZNoFixup(GetTransferDataAllocator(), Js::EquivalentTypeCache);
    }
    guard->SetCache(cache);

    // Give the cache a back-pointer to the guard so that the guard can be cleared at runtime if necessary.
    cache->SetGuard(guard);
    this->equivalentTypeGuards->Prepend(guard);
}